

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFA.cpp
# Opt level: O0

int NFALUT::double_equal(double a,double b)

{
  double local_48;
  double local_40;
  double abs_max;
  double bb;
  double aa;
  double abs_diff;
  double b_local;
  double a_local;
  
  if ((a != b) || (NAN(a) || NAN(b))) {
    local_48 = ABS(b);
    if (local_48 < ABS(a)) {
      local_48 = ABS(a);
    }
    local_40 = local_48;
    if (local_48 < 2.2250738585072014e-308) {
      local_40 = 2.2250738585072014e-308;
    }
    a_local._4_4_ = (uint)(ABS(a - b) / local_40 <= 2.220446049250313e-14);
  }
  else {
    a_local._4_4_ = 1;
  }
  return a_local._4_4_;
}

Assistant:

int NFALUT::double_equal(double a, double b)
{
	double abs_diff, aa, bb, abs_max;

	/* trivial case */
	if (a == b) return TRUE;

	abs_diff = fabs(a - b);
	aa = fabs(a);
	bb = fabs(b);
	abs_max = aa > bb ? aa : bb;

	/* DBL_MIN is the smallest normalized number, thus, the smallest
	number whose relative error is bounded by DBL_EPSILON. For
	smaller numbers, the same quantization steps as for DBL_MIN
	are used. Then, for smaller numbers, a meaningful "relative"
	error should be computed by dividing the difference by DBL_MIN. */
	if (abs_max < DBL_MIN) abs_max = DBL_MIN;

	/* equal if relative error <= factor x eps */
	return (abs_diff / abs_max) <= (RELATIVE_ERROR_FACTOR * DBL_EPSILON);
}